

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirINCTRD(void)

{
  undefined8 trd;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *filename_00;
  string local_78;
  allocator<char> local_41;
  string local_40 [8];
  string filename;
  fullpath_ref_t trdfile;
  aint local_10;
  aint length;
  aint offset;
  aint val;
  
  local_10 = 0;
  trdfile._4_4_ = 0x7fffffff;
  filename.field_2._8_8_ = GetInputFile(&lp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"",&local_41);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = anyComma(&lp);
  if ((bVar1) && (bVar1 = anyComma(&lp), !bVar1)) {
    GetDelimitedString_abi_cxx11_(&local_78,&lp);
    std::__cxx11::string::operator=(local_40,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    Error("[INCTRD] Syntax error",bp,IF_FIRST);
    SkipToEol(&lp);
    goto LAB_00110e80;
  }
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = anyComma(&lp);
    if (bVar1) {
      lp = lp + -1;
    }
    else {
      iVar2 = ParseExpressionNoSyntaxError(&lp,&length);
      if (iVar2 == 0) {
        Error("[INCTRD] Syntax error",bp,IF_FIRST);
        SkipToEol(&lp);
        goto LAB_00110e80;
      }
      if (length < 0) {
        ErrorInt("[INCTRD] Negative offset value is not allowed",length,PASS3);
        SkipToEol(&lp);
        goto LAB_00110e80;
      }
      local_10 = length;
    }
    bVar1 = anyComma(&lp);
    if (bVar1) {
      iVar2 = ParseExpressionNoSyntaxError(&lp,&length);
      if (iVar2 == 0) {
        Error("[INCTRD] Syntax error",bp,IF_FIRST);
        SkipToEol(&lp);
        goto LAB_00110e80;
      }
      if (length < 0) {
        ErrorInt("[INCTRD] Negative length value is not allowed",length,PASS3);
        SkipToEol(&lp);
        goto LAB_00110e80;
      }
      trdfile._4_4_ = length;
    }
  }
  trd = filename.field_2._8_8_;
  filename_00 = (char *)std::__cxx11::string::c_str();
  iVar2 = TRD_PrepareIncFile((fullpath_ref_t)trd,filename_00,&local_10,(aint *)((long)&trdfile + 4))
  ;
  if (iVar2 != 0) {
    BinIncFile((fullpath_ref_t)filename.field_2._8_8_,local_10,trdfile._4_4_);
  }
LAB_00110e80:
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

static void dirINCTRD() {
	aint val, offset = 0, length = INT_MAX;
	fullpath_ref_t trdfile = GetInputFile(lp);
	std::string filename {""};
	if (anyComma(lp) && !anyComma(lp)) filename = GetDelimitedString(lp);
	if (filename.empty()) {
		// file-in-disk syntax error
		Error("[INCTRD] Syntax error", bp, IF_FIRST);
		SkipToEol(lp);
		return;
	}
	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCTRD] Syntax error", bp, IF_FIRST);
				SkipToEol(lp);
				return;
			}
			if (val < 0) {
				ErrorInt("[INCTRD] Negative offset value is not allowed", val);
				SkipToEol(lp);
				return;
			}
			offset = val;
		} else --lp;		// there was second comma right after, reread it
		if (anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCTRD] Syntax error", bp, IF_FIRST);
				SkipToEol(lp);
				return;
			}
			if (val < 0) {
				ErrorInt("[INCTRD] Negative length value is not allowed", val);
				SkipToEol(lp);
				return;
			}
			length = val;
		}
	}
	if (TRD_PrepareIncFile(trdfile, filename.c_str(), offset, length)) {
		BinIncFile(trdfile, offset, length);
	}
}